

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# driver.cpp
# Opt level: O2

DomObjectHashConstIt<DomButtonGroup> __thiscall
Driver::findByAttributeNameIt<DomButtonGroup>
          (Driver *this,DomObjectHash<DomButtonGroup> *domHash,QString *name)

{
  Span *pSVar1;
  long *plVar2;
  bool bVar3;
  Data<QHashPrivate::Node<const_DomButtonGroup_*,_QString>_> *pDVar4;
  ulong uVar5;
  size_t sVar6;
  long in_FS_OFFSET;
  DomObjectHashConstIt<DomButtonGroup> DVar7;
  QArrayDataPointer<char16_t> local_58;
  piter local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = (piter)QHash<const_DomButtonGroup_*,_QString>::cbegin(domHash);
  sVar6 = 0;
  do {
    if (local_40.d == (Data<QHashPrivate::Node<const_DomButtonGroup_*,_QString>_> *)0x0 &&
        local_40.bucket == 0) {
      pDVar4 = (Data<QHashPrivate::Node<const_DomButtonGroup_*,_QString>_> *)0x0;
LAB_00142640:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        DVar7.i.bucket = sVar6;
        DVar7.i.d = pDVar4;
        return (DomObjectHashConstIt<DomButtonGroup>)DVar7.i;
      }
      __stack_chk_fail();
    }
    pSVar1 = (local_40.d)->spans;
    uVar5 = local_40.bucket >> 7;
    plVar2 = *(long **)pSVar1[uVar5].entries[pSVar1[uVar5].offsets[(uint)local_40.bucket & 0x7f]].
                       storage.data;
    local_58.d = (Data *)*plVar2;
    local_58.ptr = (char16_t *)plVar2[1];
    local_58.size = plVar2[2];
    if (local_58.d != (Data *)0x0) {
      LOCK();
      ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    bVar3 = comparesEqual((QString *)&local_58,name);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    if (bVar3) {
      pDVar4 = local_40.d;
      sVar6 = local_40.bucket;
      goto LAB_00142640;
    }
    QHashPrivate::iterator<QHashPrivate::Node<const_DomButtonGroup_*,_QString>_>::operator++
              (&local_40);
  } while( true );
}

Assistant:

Driver::DomObjectHashConstIt<DomClass>
    Driver::findByAttributeNameIt(const DomObjectHash<DomClass> &domHash,
                                  const QString &name) const
{
    const auto end = domHash.cend();
    for (auto it = domHash.cbegin(); it != end; ++it) {
        if (it.key()->attributeName() == name)
            return it;
    }
    return end;
}